

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::T_formatter<spdlog::details::scoped_padder>::format
          (T_formatter<spdlog::details::scoped_padder> *this,log_msg *param_2,tm *tm_time,
          memory_buf_t *dest)

{
  buffer<char> *in_RCX;
  scoped_padder p;
  size_t field_size;
  undefined2 in_stack_ffffffffffffffa0;
  char cVar1;
  char cVar2;
  undefined4 in_stack_ffffffffffffffa4;
  memory_buf_t *in_stack_ffffffffffffffa8;
  padding_info *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  memory_buf_t *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  
  scoped_padder::scoped_padder
            ((scoped_padder *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  fmt_helper::pad2(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
  cVar2 = ':';
  ::fmt::v8::detail::buffer<char>::push_back(in_RCX,&stack0xffffffffffffffa3);
  fmt_helper::pad2(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
  cVar1 = ':';
  ::fmt::v8::detail::buffer<char>::push_back(in_RCX,&stack0xffffffffffffffa2);
  fmt_helper::pad2(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
  scoped_padder::~scoped_padder
            ((scoped_padder *)
             CONCAT44(in_stack_ffffffffffffffa4,
                      CONCAT13(cVar2,CONCAT12(cVar1,in_stack_ffffffffffffffa0))));
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 8;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
    }